

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

Fl_Widget * __thiscall Fl_Window_Type::enter_live_mode(Fl_Window_Type *this,int param_1)

{
  bool bVar1;
  int X;
  int Y;
  int W;
  int H;
  Fl_Window *this_00;
  Fl_Type *local_38;
  Fl_Type *n;
  Fl_Window *win;
  int param_1_local;
  Fl_Window_Type *this_local;
  
  this_00 = (Fl_Window *)operator_new(0xf0);
  X = Fl_Widget::x((this->super_Fl_Widget_Type).o);
  Y = Fl_Widget::y((this->super_Fl_Widget_Type).o);
  W = Fl_Widget::w((this->super_Fl_Widget_Type).o);
  H = Fl_Widget::h((this->super_Fl_Widget_Type).o);
  Fl_Window::Fl_Window(this_00,X,Y,W,H,(char *)0x0);
  (this->super_Fl_Widget_Type).live_widget = (Fl_Widget *)this_00;
  if ((this->super_Fl_Widget_Type).live_widget != (Fl_Widget *)0x0) {
    (*(this->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x15])();
    local_38 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
    while( true ) {
      bVar1 = false;
      if (local_38 != (Fl_Type *)0x0) {
        bVar1 = (this->super_Fl_Widget_Type).super_Fl_Type.level < local_38->level;
      }
      if (!bVar1) break;
      if (local_38->level == (this->super_Fl_Widget_Type).super_Fl_Type.level + 1) {
        (*local_38->_vptr_Fl_Type[0x13])(local_38,0);
      }
      local_38 = local_38->next;
    }
    Fl_Group::end((Fl_Group *)this_00);
  }
  return (this->super_Fl_Widget_Type).live_widget;
}

Assistant:

Fl_Widget *Fl_Window_Type::enter_live_mode(int) {
  Fl_Window *win = new Fl_Window(o->x(), o->y(), o->w(), o->h());
  live_widget = win;
  if (live_widget) {
    copy_properties();
    Fl_Type *n;
    for (n = next; n && n->level > level; n = n->next) {
      if (n->level == level+1)
        n->enter_live_mode();
    }
    win->end();
  }
  return live_widget;
}